

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUIEditBox::getLineFromPos(CGUIEditBox *this,s32 pos)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  
  if ((this->WordWrap != false) || (iVar2 = 0, this->MultiLine == true)) {
    piVar1 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)(this->BrokenTextPositions).m_data.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      if (pos < piVar1[lVar3]) {
        iVar2 = (int)lVar3;
        break;
      }
    }
    iVar2 = iVar2 + -1;
  }
  return iVar2;
}

Assistant:

s32 CGUIEditBox::getLineFromPos(s32 pos)
{
	if (!WordWrap && !MultiLine)
		return 0;

	s32 i = 0;
	while (i < (s32)BrokenTextPositions.size()) {
		if (BrokenTextPositions[i] > pos)
			return i - 1;
		++i;
	}
	return (s32)BrokenTextPositions.size() - 1;
}